

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuffer_demo.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *__ptr;
  char *text;
  int i;
  int letter;
  strbuffer_t buffer;
  char **argv_local;
  int argc_local;
  
  buffer._16_8_ = argv;
  strbuffer_init((strbuffer_t *)&i,0x14,10);
  for (text._4_4_ = 0x41; text._4_4_ < 0x5b; text._4_4_ = text._4_4_ + 1) {
    strbuffer_reset((strbuffer_t *)&i);
    for (text._0_4_ = 0; (int)text < 300; text._0_4_ = (int)text + 1) {
      strbuffer_append((strbuffer_t *)&i,(char)text._4_4_);
      __ptr = strbuffer_tostring((strbuffer_t *)&i);
      printf("text = %s\n",__ptr);
      printf("buffer capacity = %d, pos = %d, increment = %d\n",(ulong)(uint)buffer.data,
             (ulong)(uint)buffer.capacity,(ulong)buffer.data._4_4_);
      free(__ptr);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char*argv[])
{
    strbuffer_t buffer;
    strbuffer_init(&buffer, 20, 10);
    for (int letter='A'; letter <= 'Z'; letter++)
    {
        strbuffer_reset(&buffer);
        for (int i=0; i < 300; i++)
        {
            strbuffer_append(&buffer, letter);
            char* text = strbuffer_tostring(&buffer);
            printf("text = %s\n", text);
            printf("buffer capacity = %d, pos = %d, increment = %d\n", buffer.capacity, buffer.pos, buffer.increment);
            free(text);
        }
    }
}